

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O2

int Abc_FlowRetime_GetLag(Abc_Obj_t *pObj)

{
  int iVar1;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) == 8) {
    __assert_fail("!Abc_ObjIsLatch(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                  ,0x52c,"int Abc_FlowRetime_GetLag(Abc_Obj_t *)");
  }
  if (pObj->Id < pManMR->vLags->nSize) {
    iVar1 = Vec_IntEntry(pManMR->vLags,pObj->Id);
    return iVar1;
  }
  __assert_fail("(int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                ,0x52d,"int Abc_FlowRetime_GetLag(Abc_Obj_t *)");
}

Assistant:

int 
Abc_FlowRetime_GetLag( Abc_Obj_t *pObj ) {
  assert( !Abc_ObjIsLatch(pObj) );
  assert( (int)Abc_ObjId(pObj) < Vec_IntSize(pManMR->vLags) );

  return Vec_IntEntry(pManMR->vLags, Abc_ObjId(pObj));
}